

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

bool divsufsortxx::helper::
     partition<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (iterator Td,iterator first1,iterator first2,iterator last,iterator *mfirst,
               iterator *mlast,value_type *v)

{
  BitmapArray<long> *pBVar1;
  reference rhs;
  reference rhs_00;
  reference rhs_01;
  reference rhs_02;
  reference rhs_03;
  iterator first2_00;
  iterator first2_01;
  reference lhs;
  reference lhs_00;
  reference lhs_01;
  reference lhs_02;
  reference lhs_03;
  BitmapArray<long> *this;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  long lVar3;
  pos_type pVar4;
  BitmapArray<long> *pBVar5;
  BitmapArray<long> *pBVar6;
  BitmapArray<long> *pBVar7;
  pos_type pVar8;
  BitmapArray<long> *pBVar9;
  BitmapArray<long> *pBVar10;
  ulong uVar11;
  BitmapArray<long> *pBVar12;
  pos_type pVar13;
  BitmapArray<long> *pBVar14;
  long lVar15;
  long lVar16;
  iterator first1_00;
  iterator first1_01;
  iterator last1;
  iterator last1_00;
  BitmapArray<long> *in_stack_ffffffffffffff98;
  pos_type in_stack_ffffffffffffffa8;
  ulong uVar17;
  BitmapArray<long> *pBVar18;
  
  pVar13 = last.pos_;
  last1_00.pos_ = first2.array_;
  pVar4 = first1.pos_;
  pBVar5 = first1.array_;
  pVar8 = Td.pos_;
  pBVar9 = Td.array_;
  for (pBVar10 = (BitmapArray<long> *)first2.pos_; uVar11 = pVar13, pBVar7 = pBVar10,
      this = last.array_, pBVar6 = pBVar10, pBVar10 < pVar13;
      pBVar10 = (BitmapArray<long> *)((long)&(pBVar10->super_Bitmap)._vptr_Bitmap + 1)) {
    iVar2 = (*((last1_00.pos_)->super_Bitmap)._vptr_Bitmap[5])(last1_00.pos_,pBVar10);
    iVar2 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,CONCAT44(extraout_var,iVar2) + pVar8);
    if (CONCAT44(extraout_var_00,iVar2) != *v) {
      this = last.array_;
      if (CONCAT44(extraout_var_00,iVar2) < *v) goto LAB_0010e3c4;
      break;
    }
  }
  goto LAB_0010e438;
LAB_0010e3c4:
  pBVar6 = (BitmapArray<long> *)((long)&(pBVar10->super_Bitmap)._vptr_Bitmap + 1);
  this = last.array_;
  if (pBVar6 < pVar13) {
    iVar2 = (*((last1_00.pos_)->super_Bitmap)._vptr_Bitmap[5])(last1_00.pos_,pBVar6);
    iVar2 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])
                      (pBVar9,CONCAT44(extraout_var_01,iVar2) + pVar8);
    this = last.array_;
    if (*v < CONCAT44(extraout_var_02,iVar2)) goto LAB_0010e438;
    pBVar10 = (BitmapArray<long> *)((long)&(pBVar10->super_Bitmap)._vptr_Bitmap + 1);
    if (CONCAT44(extraout_var_02,iVar2) == *v) {
      lhs.pos_ = in_stack_ffffffffffffffa8;
      lhs.array_ = pBVar7;
      rhs.pos_ = (pos_type)in_stack_ffffffffffffff98;
      rhs.array_ = (BitmapArray<long> *)0x10e419;
      bitmap::swap(lhs,rhs);
      pBVar7 = (BitmapArray<long> *)((long)&(pBVar7->super_Bitmap)._vptr_Bitmap + 1);
    }
    goto LAB_0010e3c4;
  }
LAB_0010e438:
  do {
    uVar17 = uVar11;
    uVar11 = uVar17 - 1;
    if (uVar11 <= pBVar6) goto LAB_0010e4d4;
    iVar2 = (*(this->super_Bitmap)._vptr_Bitmap[5])(this,uVar11);
    iVar2 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])
                      (pBVar9,CONCAT44(extraout_var_03,iVar2) + pVar8);
  } while (CONCAT44(extraout_var_04,iVar2) == *v);
  pBVar10 = (BitmapArray<long> *)uVar11;
  if (*v < CONCAT44(extraout_var_04,iVar2)) {
    while (uVar17 = uVar11 - 1, pBVar12 = pBVar6, pBVar6 < uVar17) {
      iVar2 = (*(this->super_Bitmap)._vptr_Bitmap[5])(this);
      iVar2 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar9,CONCAT44(extraout_var_05,iVar2) + pVar8);
      if (CONCAT44(extraout_var_06,iVar2) < *v) {
        pBVar12 = (BitmapArray<long> *)(uVar11 - 1);
        break;
      }
      uVar11 = uVar17;
      if (CONCAT44(extraout_var_06,iVar2) == *v) {
        lhs_00.pos_ = uVar17;
        lhs_00.array_ = pBVar7;
        rhs_00.pos_ = (pos_type)in_stack_ffffffffffffff98;
        rhs_00.array_ = (BitmapArray<long> *)0x10e4cd;
        bitmap::swap(lhs_00,rhs_00);
        pBVar10 = (BitmapArray<long> *)&pBVar10[-1].field_0x27;
      }
    }
  }
  else {
LAB_0010e4d4:
    pBVar10 = (BitmapArray<long> *)(uVar17 - 1);
    pBVar12 = pBVar10;
  }
LAB_0010e4da:
  if (pBVar6 < pBVar12) {
    lhs_01.pos_ = (pos_type)pBVar10;
    lhs_01.array_ = pBVar7;
    rhs_01.pos_ = (pos_type)in_stack_ffffffffffffff98;
    rhs_01.array_ = (BitmapArray<long> *)0x10e4fb;
    bitmap::swap(lhs_01,rhs_01);
    pBVar14 = pBVar6;
    while (pBVar1 = (BitmapArray<long> *)((long)&(pBVar14->super_Bitmap)._vptr_Bitmap + 1),
          pBVar18 = pBVar10, pBVar6 = pBVar12, pBVar1 < pBVar12) {
      iVar2 = (*((last1_00.pos_)->super_Bitmap)._vptr_Bitmap[5])(last1_00.pos_,pBVar1);
      iVar2 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar9,CONCAT44(extraout_var_07,iVar2) + pVar8);
      if (*v < CONCAT44(extraout_var_08,iVar2)) {
        pBVar18 = pBVar10;
        pBVar6 = (BitmapArray<long> *)((long)&(pBVar14->super_Bitmap)._vptr_Bitmap + 1);
        break;
      }
      pBVar14 = pBVar1;
      if (CONCAT44(extraout_var_08,iVar2) == *v) {
        lhs_02.pos_ = (pos_type)pBVar10;
        lhs_02.array_ = pBVar7;
        rhs_02.pos_ = (pos_type)in_stack_ffffffffffffff98;
        rhs_02.array_ = (BitmapArray<long> *)0x10e54d;
        bitmap::swap(lhs_02,rhs_02);
        pBVar7 = (BitmapArray<long> *)((long)&(pBVar7->super_Bitmap)._vptr_Bitmap + 1);
      }
    }
LAB_0010e564:
    pBVar12 = (BitmapArray<long> *)&pBVar12[-1].field_0x27;
    if (pBVar6 < pBVar12) {
      iVar2 = (*(this->super_Bitmap)._vptr_Bitmap[5])(this,pBVar12);
      iVar2 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])
                        (pBVar9,CONCAT44(extraout_var_09,iVar2) + pVar8);
      if (CONCAT44(extraout_var_10,iVar2) < *v) goto LAB_0010e4da;
      if (CONCAT44(extraout_var_10,iVar2) == *v) {
        pBVar10 = (BitmapArray<long> *)&pBVar10[-1].field_0x27;
        lhs_03.pos_ = (pos_type)pBVar18;
        lhs_03.array_ = pBVar7;
        rhs_03.pos_ = (pos_type)in_stack_ffffffffffffff98;
        rhs_03.array_ = (BitmapArray<long> *)0x10e5b1;
        bitmap::swap(lhs_03,rhs_03);
      }
      goto LAB_0010e564;
    }
    goto LAB_0010e4da;
  }
  if (pBVar10 < pBVar7) {
    mfirst->array_ = pBVar5;
    mfirst->pos_ = pVar4;
    if (mlast == &last) goto LAB_0010e69d;
  }
  else {
    lVar16 = (long)pBVar6 - (long)pBVar7;
    lVar3 = (long)pBVar7 - pVar4;
    if (lVar16 < (long)((long)pBVar7 - pVar4)) {
      lVar3 = lVar16;
    }
    first1_00.array_ = (BitmapArray<long> *)((long)pBVar6 - lVar3);
    first2_00.pos_ = (pos_type)pBVar7;
    first2_00.array_ = in_stack_ffffffffffffff98;
    first1_00.pos_ = (pos_type)last1_00.pos_;
    last1.pos_ = (pos_type)pBVar5;
    last1.array_ = pBVar6;
    vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              ((helper *)last1_00.pos_,first1_00,last1,first2_00);
    lVar15 = (long)pBVar10 + (1 - (long)pBVar6);
    lVar3 = ~(ulong)pBVar10 + pVar13;
    if (lVar15 <= (long)(~(ulong)pBVar10 + pVar13)) {
      lVar3 = lVar15;
    }
    first1_01.array_ = (BitmapArray<long> *)(pVar13 - lVar3);
    first2_01.pos_ = (pos_type)pBVar7;
    first2_01.array_ = in_stack_ffffffffffffff98;
    first1_01.pos_ = (pos_type)this;
    last1_00.array_ = (BitmapArray<long> *)pVar13;
    vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
              ((helper *)this,first1_01,last1_00,first2_01);
    mfirst->array_ = pBVar5;
    mfirst->pos_ = lVar16 + pVar4;
    pVar13 = pVar13 - lVar15;
  }
  mlast->array_ = this;
  mlast->pos_ = pVar13;
LAB_0010e69d:
  return pBVar7 <= pBVar10;
}

Assistant:

bool partition(
    const StringIterator_type Td, SAIterator_type first1,
    SAIterator_type first2, SAIterator_type last, SAIterator_type &mfirst,
    SAIterator_type &mlast,
    const typename std::iterator_traits<StringIterator_type>::value_type &v) {
  SAIterator_type a, b, c, d;
  typename std::iterator_traits<StringIterator_type>::value_type x = 0;

  for (b = first2; (b < last) && ((x = Td[*b]) == v); ++b) {
  }
  if (((a = b) < last) && (x < v)) {
    for (; (++b < last) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
  }
  for (c = last; (b < --c) && ((x = Td[*c]) == v);) {
  }
  if ((b < (d = c)) && (x > v)) {
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }
  for (; b < c;) {
    std::iter_swap(b, c);
    for (; (++b < c) && ((x = Td[*b]) <= v);) {
      if (x == v) {
        std::iter_swap(b, a++);
      }
    }
    for (; (b < --c) && ((x = Td[*c]) >= v);) {
      if (x == v) {
        std::iter_swap(c, d--);
      }
    }
  }

  if (a <= d) {
    vecswap(b - std::min(a - first1, b - a), b, first1);
    vecswap(last - std::min(d + 1 - b, last - d - 1), last, b);
    mfirst = first1 + (b - a), mlast = last - (d + 1 - b);
    return true;
  }
  mfirst = first1, mlast = last;
  return false;
}